

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_test.cpp
# Opt level: O3

void __thiscall Parallel_DoNothing_Test::TestBody(Parallel_DoNothing_Test *this)

{
  bool bVar1;
  function<void_(pbrt::Bounds2<int>)> *func;
  char *pcVar2;
  atomic<int> counter;
  AssertionResult gtest_ar;
  Message local_90;
  AssertHelper local_88;
  atomic<int> local_7c;
  undefined1 local_78 [16];
  _Manager_type local_68;
  code *local_60;
  Bounds2i local_50;
  code *local_40;
  code *local_38;
  atomic<int> *local_30;
  undefined8 local_28;
  code *local_20;
  code *local_18;
  
  local_30 = &local_7c;
  local_78._0_8_ = &local_30;
  local_28 = 0;
  local_18 = std::
             _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel_test.cpp:34:23)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel_test.cpp:34:23)>
             ::_M_manager;
  local_7c.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  local_78._8_8_ = (undefined8 *)0x0;
  local_60 = std::
             _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.h:166:29)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.h:166:29)>
             ::_M_manager;
  pbrt::ParallelFor(0,0,(function<void_(long,_long)> *)local_78);
  if (local_68 != (_Manager_type)0x0) {
    (*local_68)((_Any_data *)local_78,(_Any_data *)local_78,__destroy_functor);
  }
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,3);
  }
  local_90.ss_.ptr_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,std::atomic<int>>
            ((internal *)local_78,"0","counter",(int *)&local_90,&local_7c);
  if (local_78[0] == '\0') {
    testing::Message::Message(&local_90);
    if ((undefined8 *)local_78._8_8_ == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel_test.cpp"
               ,0x23,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (CONCAT44(local_90.ss_.ptr_._4_4_,local_90.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_90.ss_.ptr_._4_4_,local_90.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_90.ss_.ptr_._4_4_,local_90.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_78 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  LOCK();
  local_7c.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  local_50.pMax.super_Tuple2<pbrt::Point2,_int>.x = 0;
  local_50.pMax.super_Tuple2<pbrt::Point2,_int>.y = 0;
  local_38 = std::
             _Function_handler<void_(pbrt::Bounds2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel_test.cpp:38:45)>
             ::_M_invoke;
  local_78._0_8_ = (void *)0x0;
  local_78._8_8_ = (undefined8 *)0x0;
  local_40 = std::
             _Function_handler<void_(pbrt::Bounds2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel_test.cpp:38:45)>
             ::_M_manager;
  local_50.pMin.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)&local_7c;
  pbrt::ParallelFor2D((pbrt *)local_78,&local_50,func);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,3);
  }
  local_90.ss_.ptr_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,std::atomic<int>>
            ((internal *)local_78,"0","counter",(int *)&local_90,&local_7c);
  if (local_78[0] == '\0') {
    testing::Message::Message(&local_90);
    if ((undefined8 *)local_78._8_8_ == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel_test.cpp"
               ,0x27,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (CONCAT44(local_90.ss_.ptr_._4_4_,local_90.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_90.ss_.ptr_._4_4_,local_90.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_90.ss_.ptr_._4_4_,local_90.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_78 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(Parallel, DoNothing) {
    std::atomic<int> counter{0};
    ParallelFor(0, 0, [&](int64_t) { ++counter; });
    EXPECT_EQ(0, counter);

    counter = 0;
    ParallelFor2D(Bounds2i{{0, 0}, {0, 0}}, [&](Bounds2i b) { ++counter; });
    EXPECT_EQ(0, counter);
}